

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int ffi_pairs(lua_State *L,MMS mm)

{
  CTState *cts_00;
  int iVar1;
  GCcdata *pGVar2;
  cTValue *tv_00;
  GCstr *pGVar3;
  cTValue *tv;
  CType *ct;
  CTypeID id;
  CTState *cts;
  MMS mm_local;
  lua_State *L_local;
  CTState *cts_1;
  CType *local_70;
  CType *ct_1;
  
  cts_00 = *(CTState **)((L->glref).ptr64 + 0x180);
  cts_00->L = L;
  pGVar2 = ffi_checkcdata(L,1);
  ct._4_4_ = (uint)pGVar2->ctypeid;
  for (local_70 = cts_00->tab + ct._4_4_; local_70->info >> 0x1c == 8;
      local_70 = cts_00->tab + (local_70->info & 0xffff)) {
  }
  if (local_70->info >> 0x1c == 2) {
    ct._4_4_ = local_70->info & 0xffff;
  }
  tv_00 = lj_ctype_meta(cts_00,ct._4_4_,mm);
  if (tv_00 == (cTValue *)0x0) {
    pGVar3 = lj_ctype_repr(L,ct._4_4_,(GCstr *)0x0);
    lj_err_callerv(L,LJ_ERR_FFI_BADMM,pGVar3 + 1,
                   *(long *)((L->glref).ptr64 + 0x1a8 + (ulong)mm * 8) + 0x18);
  }
  iVar1 = lj_meta_tailcall(L,tv_00);
  return iVar1;
}

Assistant:

static int ffi_pairs(lua_State *L, MMS mm)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkcdata(L, 1)->ctypeid;
  CType *ct = ctype_raw(cts, id);
  cTValue *tv;
  if (ctype_isptr(ct->info)) id = ctype_cid(ct->info);
  tv = lj_ctype_meta(cts, id, mm);
  if (!tv)
    lj_err_callerv(L, LJ_ERR_FFI_BADMM, strdata(lj_ctype_repr(L, id, NULL)),
		   strdata(mmname_str(G(L), mm)));
  return lj_meta_tailcall(L, tv);
}